

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O2

bool crnlib::file_utils::full_path(dynamic_string *path)

{
  bool bVar1;
  char *pcVar2;
  dynamic_string fn;
  dynamic_string pn;
  char buf [4096];
  
  pn.m_buf_size = 0;
  pn.m_len = 0;
  pn.m_pStr = (char *)0x0;
  fn.m_buf_size = 0;
  fn.m_len = 0;
  fn.m_pStr = (char *)0x0;
  pcVar2 = path->m_pStr;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "";
  }
  split_path(pcVar2,&pn,&fn);
  bVar1 = dynamic_string::operator==(&fn,".");
  if (bVar1) {
LAB_00115bdb:
    pcVar2 = "";
    if (path->m_pStr != (char *)0x0) {
      pcVar2 = path->m_pStr;
    }
    pcVar2 = realpath(pcVar2,buf);
    if (pcVar2 != (char *)0x0) {
      bVar1 = true;
      dynamic_string::set(path,buf,0xffffffff);
      goto LAB_00115c64;
    }
  }
  else {
    bVar1 = dynamic_string::operator==(&fn,"..");
    if (bVar1) goto LAB_00115bdb;
    if (pn.m_len == 0) {
      dynamic_string::operator=(&pn,"./");
    }
    pcVar2 = pn.m_pStr;
    if (pn.m_pStr == (char *)0x0) {
      pcVar2 = "";
    }
    pcVar2 = realpath(pcVar2,buf);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = "";
      if (fn.m_pStr != (char *)0x0) {
        pcVar2 = fn.m_pStr;
      }
      bVar1 = true;
      combine_path(path,buf,pcVar2);
      goto LAB_00115c64;
    }
  }
  bVar1 = false;
LAB_00115c64:
  dynamic_string::~dynamic_string(&fn);
  dynamic_string::~dynamic_string(&pn);
  return bVar1;
}

Assistant:

bool file_utils::full_path(dynamic_string& path) {
#ifdef WIN32
  char buf[1024];
  char* p = _fullpath(buf, path.get_ptr(), sizeof(buf));
  if (!p)
    return false;
#else
  char buf[PATH_MAX];
  char* p;
  dynamic_string pn, fn;
  split_path(path.get_ptr(), pn, fn);
  if ((fn == ".") || (fn == "..")) {
    p = realpath(path.get_ptr(), buf);
    if (!p)
      return false;
    path.set(buf);
  } else {
    if (pn.is_empty())
      pn = "./";
    p = realpath(pn.get_ptr(), buf);
    if (!p)
      return false;
    combine_path(path, buf, fn.get_ptr());
  }
#endif

  return true;
}